

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

EVclient_sinks
INT_EVclient_register_raw_sink_handler
          (CManager_conflict cm,char *name,EVRawHandlerFunc handler,void *client_data)

{
  void *pvVar1;
  char *pcVar2;
  void *in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  event_path_data evp;
  size_t size;
  
  size = *(size_t *)(in_RDI + 0x118);
  if (*(int *)(size + 0x20) == 0) {
    pvVar1 = INT_CMmalloc((size_t)in_RCX);
    *(void **)(size + 0x28) = pvVar1;
  }
  else {
    pvVar1 = INT_CMrealloc(in_RCX,size);
    *(void **)(size + 0x28) = pvVar1;
  }
  pcVar2 = strdup(in_RSI);
  *(char **)(*(long *)(size + 0x28) + (long)*(int *)(size + 0x20) * 0x20) = pcVar2;
  *(undefined8 *)(*(long *)(size + 0x28) + (long)*(int *)(size + 0x20) * 0x20 + 8) = 0;
  *(undefined8 *)(*(long *)(size + 0x28) + (long)*(int *)(size + 0x20) * 0x20 + 0x10) = in_RDX;
  *(void **)(*(long *)(size + 0x28) + (long)*(int *)(size + 0x20) * 0x20 + 0x18) = in_RCX;
  *(int *)(size + 0x20) = *(int *)(size + 0x20) + 1;
  return *(EVclient_sinks *)(size + 0x28);
}

Assistant:

extern EVclient_sinks
INT_EVclient_register_raw_sink_handler(CManager cm, char *name, EVRawHandlerFunc handler, void *client_data)
{
    event_path_data evp = cm->evp;
    if (evp->sink_handler_count == 0) {
	evp->sink_handlers = malloc(sizeof(evp->sink_handlers[0]));
    } else {
	evp->sink_handlers = realloc(evp->sink_handlers,
				     sizeof(evp->sink_handlers[0]) * (evp->sink_handler_count + 1));
    }
    evp->sink_handlers[evp->sink_handler_count].name = strdup(name);
    evp->sink_handlers[evp->sink_handler_count].format_list = NULL;
    evp->sink_handlers[evp->sink_handler_count].handler = (EVSimpleHandlerFunc)handler;
    evp->sink_handlers[evp->sink_handler_count].client_data = client_data;
    evp->sink_handler_count++;
    return evp->sink_handlers;
}